

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::LocalAccessChainConvertPass::FindTargetVars
          (LocalAccessChainConvertPass *this,Function *func)

{
  bool bVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  Instruction *pIVar5;
  value_type *__x;
  value_type *__x_00;
  value_type *__x_01;
  value_type *__x_02;
  bool is_non_ptr_access_chain;
  Op op;
  Instruction *ptrInst;
  undefined1 local_48 [4];
  uint32_t varId;
  undefined1 local_40 [8];
  iterator ii;
  undefined1 local_28 [8];
  iterator bi;
  Function *func_local;
  LocalAccessChainConvertPass *this_local;
  
  bi.iterator_._M_current =
       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
       func;
  _local_28 = opt::Function::begin(func);
  while( true ) {
    _ii = opt::Function::end((Function *)bi.iterator_._M_current);
    bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_28,
                       (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&ii);
    if (!bVar1) break;
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_28);
    BasicBlock::begin((BasicBlock *)local_40);
    while( true ) {
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_28);
      BasicBlock::end((BasicBlock *)local_48);
      bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_40,
                                (iterator_template<spvtools::opt::Instruction> *)local_48);
      if (!bVar1) break;
      pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)local_40);
      OVar3 = opt::Instruction::opcode(pIVar5);
      if (OVar3 == OpLoad || OVar3 == OpStore) {
        pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*
                           ((iterator_template<spvtools::opt::Instruction> *)local_40);
        pIVar5 = MemPass::GetPtr(&this->super_MemPass,pIVar5,(uint32_t *)((long)&ptrInst + 4));
        bVar1 = MemPass::IsTargetVar(&this->super_MemPass,ptrInst._4_4_);
        if (bVar1) {
          OVar3 = opt::Instruction::opcode(pIVar5);
          bVar1 = HasOnlySupportedRefs(this,ptrInst._4_4_);
          if (bVar1) {
            bVar1 = MemPass::IsNonPtrAccessChain(&this->super_MemPass,OVar3);
            if ((bVar1) &&
               (uVar4 = opt::Instruction::GetSingleWordInOperand(pIVar5,0), uVar4 != ptrInst._4_4_))
            {
              std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                       &(this->super_MemPass).seen_non_target_vars_,
                       (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)((long)&ptrInst + 4),__x_00);
              std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::erase(&(this->super_MemPass).seen_target_vars_,(key_type *)((long)&ptrInst + 4));
            }
            else {
              bVar2 = Is32BitConstantIndexAccessChain(this,pIVar5);
              if (bVar2) {
                if ((bVar1) && (bVar1 = AnyIndexIsOutOfBounds(this,pIVar5), bVar1)) {
                  std::
                  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                           &(this->super_MemPass).seen_non_target_vars_,
                           (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)((long)&ptrInst + 4),__x_02);
                  std::
                  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::erase(&(this->super_MemPass).seen_target_vars_,(key_type *)((long)&ptrInst + 4))
                  ;
                }
              }
              else {
                std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                         &(this->super_MemPass).seen_non_target_vars_,
                         (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)((long)&ptrInst + 4),__x_01);
                std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::erase(&(this->super_MemPass).seen_target_vars_,(key_type *)((long)&ptrInst + 4));
              }
            }
          }
          else {
            std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                     &(this->super_MemPass).seen_non_target_vars_,
                     (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)((long)&ptrInst + 4),__x);
            std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::erase(&(this->super_MemPass).seen_target_vars_,(key_type *)((long)&ptrInst + 4));
          }
        }
      }
      InstructionList::iterator::operator++((iterator *)local_40);
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_28);
  }
  return;
}

Assistant:

void LocalAccessChainConvertPass::FindTargetVars(Function* func) {
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      switch (ii->opcode()) {
        case spv::Op::OpStore:
        case spv::Op::OpLoad: {
          uint32_t varId;
          Instruction* ptrInst = GetPtr(&*ii, &varId);
          if (!IsTargetVar(varId)) break;
          const spv::Op op = ptrInst->opcode();
          // Rule out variables with non-supported refs eg function calls
          if (!HasOnlySupportedRefs(varId)) {
            seen_non_target_vars_.insert(varId);
            seen_target_vars_.erase(varId);
            break;
          }
          // Rule out variables with nested access chains
          // TODO(): Convert nested access chains
          bool is_non_ptr_access_chain = IsNonPtrAccessChain(op);
          if (is_non_ptr_access_chain && ptrInst->GetSingleWordInOperand(
                                             kAccessChainPtrIdInIdx) != varId) {
            seen_non_target_vars_.insert(varId);
            seen_target_vars_.erase(varId);
            break;
          }
          // Rule out variables accessed with non-constant indices
          if (!Is32BitConstantIndexAccessChain(ptrInst)) {
            seen_non_target_vars_.insert(varId);
            seen_target_vars_.erase(varId);
            break;
          }

          if (is_non_ptr_access_chain && AnyIndexIsOutOfBounds(ptrInst)) {
            seen_non_target_vars_.insert(varId);
            seen_target_vars_.erase(varId);
            break;
          }
        } break;
        default:
          break;
      }
    }
  }
}